

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,int *value)

{
  int *piVar1;
  StreamReader *pSVar2;
  uint __val;
  bool bVar3;
  bool bVar4;
  uint64_t pos;
  ostream *poVar5;
  long *plVar6;
  undefined8 *puVar7;
  int iVar8;
  size_type *psVar9;
  ulong uVar10;
  char cVar11;
  ulong uVar12;
  char *__lhs;
  byte bVar13;
  uint __len;
  uint uVar14;
  ulong uVar15;
  expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  flt;
  string fp_str;
  char sc;
  string __str;
  ostringstream ss_e;
  stringstream ss;
  undefined1 local_3d8 [32];
  bool local_3b8;
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  _Alloc_hider local_330;
  size_type local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [6];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pos = CurrLoc(this);
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_local_buf[0] = '\0';
  bVar4 = LexFloat(this,&local_3b0);
  if (bVar4) {
    anon_unknown_3::ParseDouble
              ((expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_3d8,&local_3b0);
    cVar11 = local_3b8;
    if (local_3b8 == false) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                 ,0x5f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_330,"ReadBasicType",0xd);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_330,0x326);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_330,"Failed to parse floating value.",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_370);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
      ::std::ios_base::~ios_base(local_2c0);
    }
    else {
      *value = (int)(double)local_3d8._0_8_;
    }
    if ((local_3b8 != false) ||
       (local_350.field_2._M_allocated_capacity = local_3d8._16_8_,
       local_350._M_dataplus._M_p = (pointer)local_3d8._0_8_,
       (undefined1 *)local_3d8._0_8_ == local_3d8 + 0x10)) goto LAB_003c3bc2;
LAB_003c3844:
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  else {
    SeekTo(this,pos);
    bVar4 = Char1(this,(char *)&local_390);
    if (bVar4) {
      piVar1 = &(this->_curr_cursor).col;
      *piVar1 = *piVar1 + 1;
      bVar4 = true;
      bVar3 = true;
      if (((char)local_390._M_dataplus._M_p != '+') &&
         (bVar3 = true, (char)local_390._M_dataplus._M_p != '-')) {
        if (9 < (byte)((char)local_390._M_dataplus._M_p - 0x30U)) {
          uVar14 = (uint)(char)local_390._M_dataplus._M_p;
          __val = -uVar14;
          if (0 < (int)uVar14) {
            __val = uVar14;
          }
          __len = 1;
          if (9 < __val) {
            __len = 3 - (__val < 100);
          }
          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
          ::std::__cxx11::string::_M_construct
                    ((ulong)&local_370,(char)__len - ((char)local_390._M_dataplus._M_p >> 7));
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_370._M_dataplus._M_p + (uVar14 >> 0x1f),__len,__val);
          puVar7 = (undefined8 *)
                   ::std::__cxx11::string::replace((ulong)&local_370,0,(char *)0x0,0x40b5c0);
          psVar9 = puVar7 + 2;
          if ((size_type *)*puVar7 == psVar9) {
            local_3d8._16_8_ = *psVar9;
            local_3d8._24_8_ = puVar7[3];
            local_3d8._0_8_ = local_3d8 + 0x10;
          }
          else {
            local_3d8._16_8_ = *psVar9;
            local_3d8._0_8_ = (size_type *)*puVar7;
          }
          local_3d8._8_8_ = puVar7[1];
          *puVar7 = psVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          plVar6 = (long *)::std::__cxx11::string::append(local_3d8);
          psVar9 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar9) {
            local_320[0]._0_8_ = *psVar9;
            local_320[0]._8_8_ = plVar6[3];
            local_330._M_p = (pointer)local_320;
          }
          else {
            local_320[0]._0_8_ = *psVar9;
            local_330._M_p = (pointer)*plVar6;
          }
          local_328 = plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          PushError(this,(string *)&local_330);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_p != local_320) {
            operator_delete(local_330._M_p,local_320[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
          goto LAB_003c39c9;
        }
        bVar3 = false;
      }
      local_330._M_p._0_1_ = (char)local_390._M_dataplus._M_p;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
    }
    else {
LAB_003c39c9:
      bVar4 = false;
      bVar3 = false;
    }
    if (bVar4) {
      do {
        pSVar2 = this->_sr;
        if ((pSVar2->length_ <= pSVar2->idx_) || (pSVar2->binary_[pSVar2->idx_] == '\0'))
        goto LAB_003c3a65;
        bVar4 = Char1(this,local_3d8);
        iVar8 = 1;
        if (bVar4) {
          if ((byte)(local_3d8[0] - 0x30) < 10) {
            local_330._M_p._0_1_ = local_3d8[0];
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
            iVar8 = 0;
          }
          else {
            pSVar2 = this->_sr;
            iVar8 = 5;
            if ((0 < (long)pSVar2->idx_) && (uVar15 = pSVar2->idx_ - 1, uVar15 <= pSVar2->length_))
            {
              pSVar2->idx_ = uVar15;
            }
          }
        }
      } while (iVar8 == 0);
      if (iVar8 != 5) {
        cVar11 = '\0';
        goto LAB_003c3bc2;
      }
LAB_003c3a65:
      if (bVar3) {
        ::std::__cxx11::stringbuf::str();
        bVar4 = local_328 == 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_p != local_320) {
          operator_delete(local_330._M_p,local_320[0]._M_allocated_capacity + 1);
        }
      }
      else {
        bVar4 = false;
      }
      if (bVar4) {
        local_3d8._0_8_ = local_3d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3d8,"Integer value expected but got sign character only.\n","");
        PushError(this,(string *)local_3d8);
        bVar4 = (undefined1 *)local_3d8._0_8_ == local_3d8 + 0x10;
      }
      else {
        ::std::__cxx11::stringbuf::str();
        uVar15 = local_3d8._8_8_;
        if ((ulong)local_3d8._8_8_ < 2) {
          bVar4 = false;
        }
        else {
          ::std::__cxx11::stringbuf::str();
          bVar4 = *local_370._M_dataplus._M_p == '0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
        }
        plVar6 = (long *)(local_3d8 + 0x10);
        if ((long *)local_3d8._0_8_ != plVar6) {
          operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
        }
        if (!bVar4) {
          ::std::__cxx11::stringbuf::str();
          if (((long *)local_3d8._0_8_ == (long *)0x0) ||
             (cVar11 = *(char *)local_3d8._0_8_, cVar11 == '\0')) {
LAB_003c3c53:
            cVar11 = '\0';
            iVar8 = -1;
          }
          else {
            if ((cVar11 == '-') || (cVar11 == '+')) {
              uVar10 = 1;
              if (local_3d8._8_8_ == 1) goto LAB_003c3c53;
            }
            else {
              uVar10 = 0;
            }
            iVar8 = 0;
            uVar12 = 0;
            if (uVar10 < (ulong)local_3d8._8_8_) {
              uVar12 = 0;
              do {
                bVar13 = *(char *)(local_3d8._0_8_ + uVar10) - 0x30;
                if (9 < bVar13) goto LAB_003c3c53;
                uVar12 = (ulong)bVar13 + uVar12 * 10;
                if (cVar11 == '-') {
                  if (0x80000000 < (long)uVar12) {
                    iVar8 = -3;
LAB_003c3ed2:
                    cVar11 = '\0';
                    goto LAB_003c3c5b;
                  }
                }
                else if (0x7fffffff < (long)uVar12) {
                  iVar8 = -2;
                  goto LAB_003c3ed2;
                }
                uVar10 = uVar10 + 1;
              } while (local_3d8._8_8_ != uVar10);
            }
            uVar15 = (ulong)(uint)-(int)uVar12;
            if (cVar11 != '-') {
              uVar15 = uVar12 & 0xffffffff;
            }
            cVar11 = '\x01';
          }
LAB_003c3c5b:
          if ((long *)local_3d8._0_8_ != plVar6) {
            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
          }
          if (cVar11 != '\0') {
            *value = (int)uVar15;
            goto LAB_003c3bc2;
          }
          if (iVar8 == -3) {
            ::std::__cxx11::stringbuf::str();
            __lhs = "Integer underflows: `";
LAB_003c3db6:
            ::std::operator+(&local_390,__lhs,&local_350);
            puVar7 = (undefined8 *)::std::__cxx11::string::append((char *)&local_390);
            psVar9 = puVar7 + 2;
            if ((size_type *)*puVar7 == psVar9) {
              local_3d8._16_8_ = *psVar9;
              local_3d8._24_8_ = puVar7[3];
              local_3d8._0_8_ = plVar6;
            }
            else {
              local_3d8._16_8_ = *psVar9;
              local_3d8._0_8_ = (size_type *)*puVar7;
            }
          }
          else {
            if (iVar8 == -2) {
              ::std::__cxx11::stringbuf::str();
              __lhs = "Integer overflows: `";
              goto LAB_003c3db6;
            }
            if (iVar8 != -1) {
              local_3d8._0_8_ = plVar6;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3d8,"Unknown parseInt error.\n","");
              PushError(this,(string *)local_3d8);
              local_350.field_2._M_allocated_capacity = local_3d8._16_8_;
              local_350._M_dataplus._M_p = (pointer)local_3d8._0_8_;
              if ((long *)local_3d8._0_8_ == plVar6) goto LAB_003c3bc2;
              goto LAB_003c3844;
            }
            ::std::__cxx11::stringbuf::str();
            ::std::operator+(&local_390,"Invalid integer input: `",&local_350);
            puVar7 = (undefined8 *)::std::__cxx11::string::append((char *)&local_390);
            psVar9 = puVar7 + 2;
            if ((size_type *)*puVar7 == psVar9) {
              local_3d8._16_8_ = *psVar9;
              local_3d8._24_8_ = puVar7[3];
              local_3d8._0_8_ = plVar6;
            }
            else {
              local_3d8._16_8_ = *psVar9;
              local_3d8._0_8_ = (size_type *)*puVar7;
            }
          }
          local_3d8._8_8_ = puVar7[1];
          *puVar7 = psVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          PushError(this,(string *)local_3d8);
          if ((long *)local_3d8._0_8_ != plVar6) {
            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_390._M_dataplus._M_p._1_7_,(char)local_390._M_dataplus._M_p) !=
              &local_390.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_390._M_dataplus._M_p._1_7_,
                                     (char)local_390._M_dataplus._M_p),
                            local_390.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p == &local_350.field_2) goto LAB_003c3bc2;
          goto LAB_003c3844;
        }
        local_3d8._0_8_ = plVar6;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3d8,"Zero padded integer value is not allowed.\n","");
        PushError(this,(string *)local_3d8);
        bVar4 = (long *)local_3d8._0_8_ == plVar6;
      }
      if (!bVar4) {
        operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
      }
    }
    cVar11 = '\0';
  }
LAB_003c3bc2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    CONCAT71(local_3b0.field_2._M_allocated_capacity._1_7_,
                             local_3b0.field_2._M_local_buf[0]) + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return (bool)cVar11;
}

Assistant:

bool AsciiParser::ReadBasicType(int *value) {
  std::stringstream ss;

  // pxrUSD allow floating-point value to `int` type.
  // so first try fp parsing.
  auto loc = CurrLoc();
  std::string fp_str;
  if (LexFloat(&fp_str)) {
    auto flt = ParseDouble(fp_str);
    if (!flt) {
      PUSH_ERROR_AND_RETURN("Failed to parse floating value.");
    } else {
      (*value) = int(flt.value());
      return true;
    }
  }

  // revert
  SeekTo(loc);

  // head character
  bool has_sign = false;
  // bool negative = false;
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign or [0-9]
    if (sc == '+') {
      // negative = false;
      has_sign = true;
    } else if (sc == '-') {
      // negative = true;
      has_sign = true;
    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
    } else {
      PushError("Sign or 0-9 expected, but got '" + std::to_string(sc) +
                "'.\n");
      return false;
    }

    ss << sc;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if ((c >= '0') && (c <= '9')) {
      ss << c;
    } else {
      _sr->seek_from_current(-1);
      break;
    }
  }

  if (has_sign && (ss.str().size() == 1)) {
    // sign only
    PushError("Integer value expected but got sign character only.\n");
    return false;
  }

  if ((ss.str().size() > 1) && (ss.str()[0] == '0')) {
    PushError("Zero padded integer value is not allowed.\n");
    return false;
  }

  // std::cout << "ReadInt token: " << ss.str() << "\n";

  int int_value;
  int err = parseInt(ss.str(), &int_value);
  if (err != 0) {
    if (err == -1) {
      PushError("Invalid integer input: `" + ss.str() + "`\n");
      return false;
    } else if (err == -2) {
      PushError("Integer overflows: `" + ss.str() + "`\n");
      return false;
    } else if (err == -3) {
      PushError("Integer underflows: `" + ss.str() + "`\n");
      return false;
    } else {
      PushError("Unknown parseInt error.\n");
      return false;
    }
  }

  (*value) = int_value;

  return true;
}